

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_shader.h
# Opt level: O1

GLuint s_loadProgram(char *vp,char *fp,char **attributes,int attributeCount)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  undefined8 in_RAX;
  ulong uVar4;
  GLint linked;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  GVar1 = s_loadShader(0x8b31,vp);
  GVar3 = 0;
  if (GVar1 != 0) {
    GVar2 = s_loadShader(0x8b30,fp);
    if (GVar2 == 0) {
      (*glad_glDeleteShader)(GVar1);
      GVar3 = 0;
    }
    else {
      GVar3 = (*glad_glCreateProgram)();
      if (GVar3 == 0) {
        s_loadProgram();
        GVar3 = 0;
      }
      else {
        (*glad_glAttachShader)(GVar3,GVar1);
        (*glad_glAttachShader)(GVar3,GVar2);
        if (0 < attributeCount) {
          uVar4 = 0;
          do {
            (*glad_glBindAttribLocation)(GVar3,(GLuint)uVar4,attributes[uVar4]);
            uVar4 = uVar4 + 1;
          } while ((uint)attributeCount != uVar4);
        }
        (*glad_glLinkProgram)(GVar3);
        (*glad_glDeleteShader)(GVar1);
        (*glad_glDeleteShader)(GVar2);
        (*glad_glGetProgramiv)(GVar3,0x8b82,&local_34);
        if (local_34 == 0) {
          s_loadProgram();
          GVar3 = 0;
        }
      }
    }
  }
  return GVar3;
}

Assistant:

static GLuint s_loadProgram(const char *vp, const char *fp, const char **attributes, int attributeCount)
{
	GLuint vertexShader = s_loadShader(GL_VERTEX_SHADER, vp);
	if (!vertexShader)
		return 0;
	GLuint fragmentShader = s_loadShader(GL_FRAGMENT_SHADER, fp);
	if (!fragmentShader)
	{
		glDeleteShader(vertexShader);
		return 0;
	}

	GLuint program = glCreateProgram();
	if (program == 0)
	{
		fprintf(stderr, "Could not create program!\n");
		return 0;
	}
	glAttachShader(program, vertexShader);
	glAttachShader(program, fragmentShader);
    
    for (int i = 0; i < attributeCount; i++)
        glBindAttribLocation(program, i, attributes[i]);
    
	glLinkProgram(program);
	glDeleteShader(vertexShader);
	glDeleteShader(fragmentShader);
	GLint linked;
	glGetProgramiv(program, GL_LINK_STATUS, &linked);
	if (!linked)
	{
		fprintf(stderr, "Could not link program!\n");
		GLint infoLen = 0;
		glGetProgramiv(program, GL_INFO_LOG_LENGTH, &infoLen);
		if (infoLen)
		{
			char* infoLog = (char*)malloc(sizeof(char) * infoLen);
			glGetProgramInfoLog(program, infoLen, NULL, infoLog);
			fprintf(stderr, "%s\n", infoLog);
			free(infoLog);
		}
		glDeleteProgram(program);
		return 0;
	}
	return program;
}